

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

LogicalXorLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_logicalxor(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LogicalXorLayerParams *pLVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x34d) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x34d;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pLVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::LogicalXorLayerParams>(arena);
    (this->layer_).logicalxor_ = pLVar2;
  }
  return (LogicalXorLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalXorLayerParams* NeuralNetworkLayer::_internal_mutable_logicalxor() {
  if (!_internal_has_logicalxor()) {
    clear_layer();
    set_has_logicalxor();
    layer_.logicalxor_ = CreateMaybeMessage< ::CoreML::Specification::LogicalXorLayerParams >(GetArenaForAllocation());
  }
  return layer_.logicalxor_;
}